

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

void Acec_TreeFilterOne2(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vTree)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  int *piVar7;
  byte bVar8;
  void *__s;
  Vec_Bit_t *vMarked;
  int *__s_00;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  size_t sVar17;
  
  uVar12 = p->nObjs;
  iVar14 = (((int)uVar12 >> 5) + 1) - (uint)((uVar12 & 0x1f) == 0);
  uVar11 = iVar14 * 0x20;
  if (iVar14 == 0) {
    sVar17 = 0;
    __s = (void *)0x0;
  }
  else {
    sVar17 = (long)iVar14 * 4;
    __s = malloc(sVar17);
  }
  memset(__s,0,sVar17);
  vMarked = (Vec_Bit_t *)malloc(0x10);
  vMarked->nCap = uVar11;
  if (iVar14 == 0) {
    __s_00 = (int *)0x0;
    sVar17 = 0;
  }
  else {
    sVar17 = (long)iVar14 << 2;
    __s_00 = (int *)malloc(sVar17);
  }
  vMarked->pArray = __s_00;
  vMarked->nSize = uVar11;
  memset(__s_00,0,sVar17);
  iVar14 = vTree->nSize;
  if (1 < iVar14) {
    piVar6 = vTree->pArray;
    lVar16 = 0;
    do {
      iVar2 = piVar6[lVar16];
      if (iVar2 < 0) goto LAB_0068614b;
      uVar9 = iVar2 * 6;
      uVar3 = vAdds->nSize;
      if (uVar3 == uVar9 || SBORROW4(uVar3,uVar9) != (int)(uVar3 + iVar2 * -6) < 0)
      goto LAB_0068614b;
      piVar7 = vAdds->pArray;
      uVar10 = piVar7[uVar9];
      if (((int)uVar10 < 0) || ((int)uVar11 <= (int)uVar10)) goto LAB_0068616a;
      puVar1 = (uint *)((long)__s + (ulong)(uVar10 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar10 & 0x1f);
      if (uVar3 <= (uVar9 | 1)) goto LAB_0068614b;
      uVar10 = piVar7[uVar9 | 1];
      if (((int)uVar10 < 0) || (uVar11 <= uVar10)) goto LAB_0068616a;
      puVar1 = (uint *)((long)__s + (ulong)(uVar10 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar10 & 0x1f);
      if (uVar3 <= uVar9 + 2) goto LAB_0068614b;
      uVar3 = piVar7[uVar9 + 2];
      if (((int)uVar3 < 0) || (uVar11 <= uVar3)) goto LAB_0068616a;
      puVar1 = (uint *)((long)__s + (ulong)(uVar3 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
      iVar2 = (int)lVar16;
      lVar16 = lVar16 + 2;
    } while (iVar2 + 3 < iVar14);
    if (1 < iVar14) {
      piVar6 = vTree->pArray;
      lVar16 = 0;
      do {
        iVar2 = piVar6[lVar16];
        if (iVar2 < 0) goto LAB_0068614b;
        uVar9 = iVar2 * 6 + 3;
        uVar3 = vAdds->nSize;
        if ((int)uVar3 <= (int)uVar9) goto LAB_0068614b;
        piVar7 = vAdds->pArray;
        uVar9 = piVar7[uVar9];
        if (((int)uVar9 < 0) || ((int)uVar11 <= (int)uVar9)) {
LAB_0068616a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        bVar8 = (byte)uVar9 & 0x1f;
        puVar1 = (uint *)((long)__s + (ulong)(uVar9 >> 5) * 4);
        *puVar1 = *puVar1 & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
        uVar9 = iVar2 * 6 + 4;
        if (uVar3 <= uVar9) goto LAB_0068614b;
        uVar3 = piVar7[uVar9];
        if (((int)uVar3 < 0) || (uVar11 <= uVar3)) goto LAB_0068616a;
        bVar8 = (byte)uVar3 & 0x1f;
        puVar1 = (uint *)((long)__s + (ulong)(uVar3 >> 5) * 4);
        *puVar1 = *puVar1 & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
        iVar2 = (int)lVar16;
        lVar16 = lVar16 + 2;
      } while (iVar2 + 3 < iVar14);
    }
  }
  if (0 < (int)uVar12) {
    lVar16 = 0;
    uVar15 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(uint *)(&p->pObjs->field_0x0 + lVar16);
      if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
        if (uVar11 <= uVar15) goto LAB_00686189;
        if ((*(uint *)((long)__s + (uVar15 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar15 & 0x1f) & 1) != 0
           ) {
          Acec_TreeMarkTFI_rec(p,(uint)uVar15,vMarked);
          uVar12 = p->nObjs;
        }
      }
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 0xc;
    } while ((long)uVar15 < (long)(int)uVar12);
    iVar14 = vTree->nSize;
  }
  uVar12 = 0;
  if (1 < iVar14) {
    lVar16 = 1;
    uVar12 = 0;
    do {
      piVar6 = vTree->pArray;
      uVar3 = piVar6[lVar16 + -1];
      if ((int)uVar3 < 0) {
LAB_0068614b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar10 = uVar3 * 6 + 3;
      uVar9 = vAdds->nSize;
      if ((int)uVar9 <= (int)uVar10) goto LAB_0068614b;
      piVar7 = vAdds->pArray;
      uVar10 = piVar7[uVar10];
      if (((int)uVar10 < 0) || ((int)uVar11 <= (int)uVar10)) goto LAB_00686189;
      uVar4 = piVar6[lVar16];
      uVar13 = uVar3 * 6 + 4;
      if (((uint)__s_00[uVar10 >> 5] >> (uVar10 & 0x1f) & 1) == 0) {
        if (uVar9 <= uVar13) goto LAB_0068614b;
        uVar5 = piVar7[uVar13];
        if (((int)uVar5 < 0) || (uVar11 <= uVar5)) {
LAB_00686189:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)__s_00[uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0) goto LAB_00686094;
        if (((int)uVar12 < 0) || (iVar14 <= (int)uVar12)) {
LAB_006861a8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar9 = uVar12 + 1;
        piVar6[uVar12] = uVar3;
        if (vTree->nSize <= (int)uVar9) goto LAB_006861a8;
        uVar12 = uVar12 + 2;
        piVar6[uVar9] = uVar4;
      }
      else {
LAB_00686094:
        if (uVar9 <= uVar13) goto LAB_0068614b;
        printf("Removing box %d=(%d,%d) of rank %d.\n",(ulong)uVar3,(ulong)uVar10,
               (ulong)(uint)piVar7[uVar13],(ulong)uVar4);
      }
      iVar14 = vTree->nSize;
      lVar16 = lVar16 + 2;
    } while ((int)lVar16 < iVar14);
  }
  if (iVar14 < (int)uVar12) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vTree->nSize = uVar12;
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (int *)0x0) {
    free(__s_00);
  }
  free(vMarked);
  return;
}

Assistant:

void Acec_TreeFilterOne2( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vTree )
{
    Vec_Bit_t * vIsLeaf = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vMarked = Vec_BitStart( Gia_ManObjNum(p) ) ;
    Gia_Obj_t * pObj;
    int i, k = 0, Box, Rank;
    // mark leaves
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+0), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+1), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+2), 1 );
    }
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+3), 0 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+4), 0 );
    }
    // mark TFI of leaves
    Gia_ManForEachAnd( p, pObj, i )
        if ( Vec_BitEntry(vIsLeaf, i) )
            Acec_TreeMarkTFI_rec( p, i, vMarked );
    // additional one
//if ( 10942 < Gia_ManObjNum(p) )
//    Acec_TreeMarkTFI_rec( p, 10942, vMarked );
    // remove those that overlap with the marked TFI
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        if ( Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+3)) || Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+4)) )
        {
            printf( "Removing box %d=(%d,%d) of rank %d.\n", Box, Vec_IntEntry(vAdds, 6*Box+3), Vec_IntEntry(vAdds, 6*Box+4), Rank ); 
            continue;
        }
        Vec_IntWriteEntry( vTree, k++, Box );
        Vec_IntWriteEntry( vTree, k++, Rank );
    }
    Vec_IntShrink( vTree, k );
    Vec_BitFree( vIsLeaf );
    Vec_BitFree( vMarked );
}